

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void updateWindowMode(_GLFWwindow *window)

{
  Atom AVar1;
  Atom AVar2;
  Atom AVar3;
  unsigned_long uVar4;
  undefined8 local_f0;
  XSetWindowAttributes attributes;
  
  AVar1 = _glfw.x11.NET_WM_FULLSCREEN_MONITORS;
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != 0) {
      XDeleteProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_FULLSCREEN_MONITORS);
    }
    AVar3 = _glfw.x11.NET_WM_STATE_FULLSCREEN;
    AVar1 = _glfw.x11.NET_WM_STATE;
    if (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0 || _glfw.x11.NET_WM_STATE == 0) {
      attributes.do_not_propagate_mask = attributes.do_not_propagate_mask & 0xffffffff00000000;
      XChangeWindowAttributes(_glfw.x11.display,(window->x11).handle,0x200);
      (window->x11).overrideRedirect = 0;
    }
    else {
      memset(&local_f0,0,0xc0);
      AVar2 = _glfw.x11.NET_WM_STATE;
      local_f0 = CONCAT44(local_f0._4_4_,0x21);
      attributes.border_pixel = (window->x11).handle;
      attributes.backing_store = 0x20;
      _glfw.x11.NET_WM_STATE._0_4_ = (undefined4)AVar1;
      _glfw.x11.NET_WM_STATE._4_4_ = SUB84(AVar1,4);
      attributes.bit_gravity = (undefined4)_glfw.x11.NET_WM_STATE;
      attributes.win_gravity = _glfw.x11.NET_WM_STATE._4_4_;
      attributes.backing_planes = 0;
      attributes.backing_pixel = AVar3;
      attributes.save_under = 0;
      attributes._68_4_ = 0;
      attributes.event_mask = 1;
      attributes.do_not_propagate_mask = 0;
      _glfw.x11.NET_WM_STATE = AVar2;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&local_f0);
    }
    XDeleteProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR);
  }
  else {
    if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != 0) {
      uVar4 = (unsigned_long)(window->monitor->x11).index;
      memset(&local_f0,0,0xc0);
      local_f0 = CONCAT44(local_f0._4_4_,0x21);
      attributes.border_pixel = (window->x11).handle;
      attributes.backing_store = 0x20;
      attributes._32_8_ = AVar1;
      attributes.do_not_propagate_mask = 0;
      attributes.backing_planes = uVar4;
      attributes.backing_pixel = uVar4;
      attributes._64_8_ = uVar4;
      attributes.event_mask = uVar4;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&local_f0);
    }
    AVar3 = _glfw.x11.NET_WM_STATE_FULLSCREEN;
    AVar1 = _glfw.x11.NET_WM_STATE;
    if (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0 || _glfw.x11.NET_WM_STATE == 0) {
      attributes.do_not_propagate_mask = CONCAT44(attributes.do_not_propagate_mask._4_4_,1);
      XChangeWindowAttributes(_glfw.x11.display,(window->x11).handle,0x200);
      (window->x11).overrideRedirect = 1;
    }
    else {
      memset(&local_f0,0,0xc0);
      AVar2 = _glfw.x11.NET_WM_STATE;
      local_f0 = CONCAT44(local_f0._4_4_,0x21);
      attributes.border_pixel = (window->x11).handle;
      attributes.backing_store = 0x20;
      _glfw.x11.NET_WM_STATE._0_4_ = (undefined4)AVar1;
      _glfw.x11.NET_WM_STATE._4_4_ = SUB84(AVar1,4);
      attributes.bit_gravity = (undefined4)_glfw.x11.NET_WM_STATE;
      attributes.win_gravity = _glfw.x11.NET_WM_STATE._4_4_;
      attributes.backing_planes = 1;
      attributes.backing_pixel = AVar3;
      attributes.save_under = 0;
      attributes._68_4_ = 0;
      attributes.event_mask = 1;
      attributes.do_not_propagate_mask = 0;
      _glfw.x11.NET_WM_STATE = AVar2;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&local_f0);
    }
    local_f0 = 1;
    XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20
                    ,0,&local_f0,1);
  }
  return;
}

Assistant:

static void updateWindowMode(_GLFWwindow* window)
{
    if (window->monitor)
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_FULLSCREEN_MONITORS,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          0);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_ADD,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            // This is the butcher's way of removing window decorations
            // Setting the override-redirect attribute on a window makes the
            // window manager ignore the window completely (ICCCM, section 4)
            // The good thing is that this makes undecorated full screen windows
            // easy to do; the bad thing is that we have to do everything
            // manually and some things (like iconify/restore) won't work at
            // all, as those are tasks usually performed by the window manager

            XSetWindowAttributes attributes;
            attributes.override_redirect = True;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_TRUE;
        }

        // Enable compositor bypass
        {
            const unsigned long value = 1;

            XChangeProperty(_glfw.x11.display,  window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                            PropModeReplace, (unsigned char*) &value, 1);
        }
    }
    else
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_FULLSCREEN_MONITORS);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_REMOVE,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            XSetWindowAttributes attributes;
            attributes.override_redirect = False;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_FALSE;
        }

        // Disable compositor bypass
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR);
        }
    }
}